

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O2

void start_input_pass(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  jpeg_error_mgr *pjVar4;
  JQUANT_TBL *__dest;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int ci;
  long lVar9;
  
  iVar8 = cinfo->comps_in_scan;
  if (iVar8 == 1) {
    uVar5 = 1;
    pjVar3 = cinfo->cur_comp_info[0];
    cinfo->MCUs_per_row = pjVar3->width_in_blocks;
    uVar6 = pjVar3->height_in_blocks;
    cinfo->MCU_rows_in_scan = uVar6;
    pjVar3->MCU_width = 1;
    pjVar3->MCU_height = 1;
    pjVar3->MCU_blocks = 1;
    pjVar3->MCU_sample_width = pjVar3->DCT_h_scaled_size;
    pjVar3->last_col_width = 1;
    uVar6 = uVar6 % (uint)pjVar3->v_samp_factor;
    if (uVar6 == 0) {
      uVar6 = pjVar3->v_samp_factor;
    }
    pjVar3->last_row_height = uVar6;
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;
  }
  else {
    if (iVar8 - 5U < 0xfffffffc) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x1b;
      (pjVar4->msg_parm).i[0] = iVar8;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    lVar9 = jdiv_round_up((ulong)cinfo->image_width,
                          (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
    cinfo->MCUs_per_row = (JDIMENSION)lVar9;
    lVar9 = jdiv_round_up((ulong)cinfo->image_height,
                          (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
    cinfo->MCU_rows_in_scan = (JDIMENSION)lVar9;
    cinfo->blocks_in_MCU = 0;
    for (lVar9 = 0; uVar5 = (ulong)cinfo->comps_in_scan, lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
      pjVar3 = cinfo->cur_comp_info[lVar9];
      uVar6 = pjVar3->h_samp_factor;
      uVar1 = pjVar3->v_samp_factor;
      pjVar3->MCU_width = uVar6;
      pjVar3->MCU_height = uVar1;
      iVar8 = uVar1 * uVar6;
      pjVar3->MCU_blocks = iVar8;
      pjVar3->MCU_sample_width = pjVar3->DCT_h_scaled_size * uVar6;
      uVar7 = pjVar3->width_in_blocks % uVar6;
      if (uVar7 == 0) {
        uVar7 = uVar6;
      }
      pjVar3->last_col_width = uVar7;
      uVar6 = (uint)((ulong)pjVar3->height_in_blocks % (ulong)uVar1);
      if (uVar6 == 0) {
        uVar6 = uVar1;
      }
      pjVar3->last_row_height = uVar6;
      if (10 < cinfo->blocks_in_MCU + iVar8) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0xe;
        (*pjVar4->error_exit)((j_common_ptr)cinfo);
      }
      for (; 0 < iVar8; iVar8 = iVar8 + -1) {
        iVar2 = cinfo->blocks_in_MCU;
        cinfo->blocks_in_MCU = iVar2 + 1;
        cinfo->MCU_membership[iVar2] = (int)lVar9;
      }
    }
  }
  for (lVar9 = 0; lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
    pjVar3 = cinfo->cur_comp_info[lVar9];
    if (pjVar3->quant_table == (JQUANT_TBL *)0x0) {
      uVar6 = pjVar3->quant_tbl_no;
      if ((3 < (ulong)uVar6) || (cinfo->quant_tbl_ptrs[uVar6] == (JQUANT_TBL *)0x0)) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0x36;
        (pjVar4->msg_parm).i[0] = uVar6;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      __dest = (JQUANT_TBL *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x84);
      memcpy(__dest,cinfo->quant_tbl_ptrs[(int)uVar6],0x84);
      pjVar3->quant_table = __dest;
      uVar5 = (ulong)(uint)cinfo->comps_in_scan;
    }
  }
  (*cinfo->entropy->start_pass)(cinfo);
  (*cinfo->coef->start_input_pass)(cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
  return;
}

Assistant:

METHODDEF(void)
start_input_pass (j_decompress_ptr cinfo)
{
  per_scan_setup(cinfo);
  latch_quant_tables(cinfo);
  (*cinfo->entropy->start_pass) (cinfo);
  (*cinfo->coef->start_input_pass) (cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
}